

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_generic_trigo.hpp
# Opt level: O0

batch<float,_xsimd::sse4_2>
xsimd::kernel::asin<xsimd::sse4_2>(batch<float,_xsimd::sse4_2> *self,requires_arch<generic> param_2)

{
  float *self_00;
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  float extraout_XMM0_Dd_08;
  float extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  float extraout_XMM0_Dd_11;
  float extraout_XMM0_Dd_12;
  float extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  batch<float,_xsimd::sse4_2> bVar5;
  batch_bool<float,_xsimd::sse4_2> bVar6;
  simd_register<float,_xsimd::sse4_2> sVar7;
  simd_register<float,_xsimd::sse3> local_158;
  batch<float,_xsimd::sse4_2> local_148;
  batch<float,_xsimd::sse4_2> local_138;
  undefined1 local_128 [16];
  simd_register<float,_xsimd::sse3> local_118;
  undefined1 local_108 [16];
  undefined1 auStack_f8 [8];
  batch_type z1;
  undefined8 uStack_d0;
  simd_register<float,_xsimd::sse3> local_c8;
  batch<float,_xsimd::sse4_2> local_b8;
  simd_register<float,_xsimd::sse3> local_a8;
  batch<float,_xsimd::sse4_2> local_98;
  simd_register<float,_xsimd::sse3> local_88;
  undefined1 auStack_78 [8];
  batch_type z;
  undefined1 auStack_58 [8];
  batch_bool<float,_xsimd::sse4_2> x_larger_05;
  batch_type sign;
  batch_type x;
  requires_arch<generic> param_2_local;
  batch<float,_xsimd::sse4_2> *self_local;
  
  bVar5 = abs<float,xsimd::sse4_2>(self);
  x.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)extraout_XMM0_Dc;
  sign.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data._8_8_ =
       bVar5.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  x.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)extraout_XMM0_Dd;
  bVar5 = bitofsign<float,xsimd::sse4_2>(self);
  unique0x100000e8 = extraout_XMM0_Dc_00;
  x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
       bVar5.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  unique0x100000ec = extraout_XMM0_Dd_00;
  batch<float,_xsimd::sse4_2>::batch
            ((batch<float,_xsimd::sse4_2> *)
             ((long)z.super_simd_register<float,_xsimd::sse4_2>.
                    super_simd_register<float,_xsimd::sse4_1>.
                    super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>
                    .super_simd_register<float,_xsimd::sse2>.data + 8),0.5);
  bVar6 = operator>((batch<float,_xsimd::sse4_2> *)
                    ((long)sign.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data + 8),
                    (batch<float,_xsimd::sse4_2> *)
                    ((long)z.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data + 8));
  unique0x1000010c = (float)extraout_XMM0_Dc_01;
  auStack_58._0_4_ =
       (float)(int)bVar6.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auStack_58._4_4_ =
       (float)(int)((ulong)bVar6.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  unique0x10000110 = extraout_XMM0_Dd_01;
  batch<float,_xsimd::sse4_2>::batch(&local_98,0.5);
  batch<float,_xsimd::sse4_2>::batch(&local_b8,1.0);
  bVar5 = xsimd::operator-(&local_b8,
                           (batch<float,_xsimd::sse4_2> *)
                           ((long)sign.super_simd_register<float,_xsimd::sse4_2>.
                                  super_simd_register<float,_xsimd::sse4_1>.
                                  super_simd_register<float,_xsimd::ssse3>.
                                  super_simd_register<float,_xsimd::sse3>.
                                  super_simd_register<float,_xsimd::sse2>.data + 8));
  local_a8.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_02;
  local_a8.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_a8.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_a8.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_02;
  bVar5 = xsimd::operator*(&local_98,(batch<float,_xsimd::sse4_2> *)&local_a8);
  local_88.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_03;
  local_88.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_88.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_88.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_03;
  self_00 = (float *)((long)sign.super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8);
  bVar5 = xsimd::operator*((batch<float,_xsimd::sse4_2> *)self_00,
                           (batch<float,_xsimd::sse4_2> *)self_00);
  local_c8.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_04;
  local_c8.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_c8.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_c8.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_04;
  bVar5 = select<float,xsimd::sse4_2>
                    ((batch_bool<float,_xsimd::sse4_2> *)auStack_58,
                     (batch<float,_xsimd::sse4_2> *)&local_88,
                     (batch<float,_xsimd::sse4_2> *)&local_c8);
  z.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)extraout_XMM0_Dc_05;
  auStack_78._0_4_ =
       (int)bVar5.super_simd_register<float,_xsimd::sse4_2>.
            super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
            super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data.
            _0_8_;
  auStack_78._4_4_ =
       (int)((ulong)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                    super_simd_register<float,_xsimd::sse4_1>.
                    super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>
                    .super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  z.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = extraout_XMM0_Dd_05;
  bVar5 = sqrt<float,xsimd::sse4_2>((batch<float,_xsimd::sse4_2> *)auStack_78);
  unique0x100001c0 = extraout_XMM0_Dc_06;
  z1.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data._8_8_ =
       bVar5.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  unique0x100001c4 = extraout_XMM0_Dd_06;
  bVar5 = select<float,xsimd::sse4_2>
                    ((batch_bool<float,_xsimd::sse4_2> *)auStack_58,
                     (batch<float,_xsimd::sse4_2> *)
                     ((long)z1.super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8),
                     (batch<float,_xsimd::sse4_2> *)
                     ((long)sign.super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8));
  uVar2 = bVar5.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
          super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
          super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auVar1._8_4_ = extraout_XMM0_Dc_07;
  auVar1._0_8_ = uVar2;
  auVar1._12_4_ = extraout_XMM0_Dd_07;
  uStack_d0 = auVar1._8_8_;
  x.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)(undefined4)uStack_d0;
  x.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)uStack_d0._4_4_;
  sign.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)(int)uVar2;
  sign.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = (float)(int)((ulong)uVar2 >> 0x20);
  bVar5 = detail::
          horner<xsimd::batch<float,xsimd::sse4_2>,1042983652ul,1033470198ul,1027227335ul,1019615203ul,1026339666ul>
                    ((batch<float,_xsimd::sse4_2> *)auStack_78);
  z1.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)extraout_XMM0_Dc_08;
  auStack_f8._0_4_ =
       (int)bVar5.super_simd_register<float,_xsimd::sse4_2>.
            super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
            super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data.
            _0_8_;
  auStack_f8._4_4_ =
       (int)((ulong)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                    super_simd_register<float,_xsimd::sse4_1>.
                    super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>
                    .super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  z1.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = extraout_XMM0_Dd_08;
  bVar5 = xsimd::operator*((batch<float,_xsimd::sse4_2> *)auStack_78,
                           (batch<float,_xsimd::sse4_2> *)
                           ((long)sign.super_simd_register<float,_xsimd::sse4_2>.
                                  super_simd_register<float,_xsimd::sse4_1>.
                                  super_simd_register<float,_xsimd::ssse3>.
                                  super_simd_register<float,_xsimd::sse3>.
                                  super_simd_register<float,_xsimd::sse2>.data + 8));
  local_118.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_09;
  local_118.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_118.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_118.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_09;
  bVar5 = fma<float,xsimd::sse4_2>
                    ((batch<float,_xsimd::sse4_2> *)auStack_f8,
                     (batch<float,_xsimd::sse4_2> *)&local_118,
                     (batch<float,_xsimd::sse4_2> *)
                     ((long)sign.super_simd_register<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8));
  uVar2 = bVar5.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
          super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
          super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auVar3._8_4_ = extraout_XMM0_Dc_10;
  auVar3._0_8_ = uVar2;
  auVar3._12_4_ = extraout_XMM0_Dd_10;
  local_108._8_8_ = auVar3._8_8_;
  z1.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)local_108._8_4_;
  z1.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)local_108._12_4_;
  auStack_f8._0_4_ = (int)uVar2;
  auStack_f8._4_4_ = (int)((ulong)uVar2 >> 0x20);
  local_108 = auVar3;
  bVar5 = constants::pio2<xsimd::batch<float,xsimd::sse4_2>>();
  local_148.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_11;
  local_148.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_148.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_148.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_11;
  bVar5 = xsimd::operator+((batch<float,_xsimd::sse4_2> *)auStack_f8,
                           (batch<float,_xsimd::sse4_2> *)auStack_f8);
  local_158.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_12;
  local_158.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_158.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_158.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_12;
  bVar5 = xsimd::operator-(&local_148,(batch<float,_xsimd::sse4_2> *)&local_158);
  local_138.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_13;
  local_138.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_138.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar5.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_138.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_13;
  bVar5 = select<float,xsimd::sse4_2>
                    ((batch_bool<float,_xsimd::sse4_2> *)auStack_58,&local_138,
                     (batch<float,_xsimd::sse4_2> *)auStack_f8);
  uVar2 = bVar5.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
          super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
          super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auVar4._8_4_ = extraout_XMM0_Dc_14;
  auVar4._0_8_ = uVar2;
  auVar4._12_4_ = extraout_XMM0_Dd_14;
  local_128._8_8_ = auVar4._8_8_;
  z.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)local_128._8_4_;
  z.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)local_128._12_4_;
  auStack_78._0_4_ = (int)uVar2;
  auStack_78._4_4_ = (int)((ulong)uVar2 >> 0x20);
  local_128 = auVar4;
  sVar7.super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data =
       (simd_register<float,_xsimd::sse4_1>)
       operator^((batch<float,_xsimd::sse4_2> *)auStack_78,
                 (batch<float,_xsimd::sse4_2> *)
                 ((long)x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                        super_simd_register<float,_xsimd::sse4_1>.
                        super_simd_register<float,_xsimd::ssse3>.
                        super_simd_register<float,_xsimd::sse3>.
                        super_simd_register<float,_xsimd::sse2>.data + 8));
  return (simd_register<float,_xsimd::sse4_2>)
         (simd_register<float,_xsimd::sse4_2>)
         sVar7.super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
         super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data;
}

Assistant:

inline batch<float, A> asin(batch<float, A> const& self, requires_arch<generic>) noexcept
        {
            using batch_type = batch<float, A>;
            batch_type x = abs(self);
            batch_type sign = bitofsign(self);
            auto x_larger_05 = x > batch_type(0.5);
            batch_type z = select(x_larger_05, batch_type(0.5) * (batch_type(1.) - x), x * x);
            x = select(x_larger_05, sqrt(z), x);
            batch_type z1 = detail::horner<batch_type,
                                           0x3e2aaae4,
                                           0x3d9980f6,
                                           0x3d3a3ec7,
                                           0x3cc617e3,
                                           0x3d2cb352>(z);
            z1 = fma(z1, z * x, x);
            z = select(x_larger_05, constants::pio2<batch_type>() - (z1 + z1), z1);
            return z ^ sign;
        }